

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O1

void __thiscall Regex::~Regex(Regex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->mErrorData).mErrorString._M_dataplus._M_p;
  paVar1 = &(this->mErrorData).mErrorString.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  JetHead::vector<Regex::GroupData>::~vector(&this->mGroups);
  Element::~Element(&this->mRoot);
  return;
}

Assistant:

Regex::~Regex()
{
}